

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

void Abc_SopComplementVar(char *pSop,int iVar)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  
  for (lVar3 = 0; pSop[lVar3] != '\0'; lVar3 = lVar3 + 1) {
    if (pSop[lVar3] == '\n') {
      iVar2 = (int)lVar3 + -2;
      goto LAB_001ede46;
    }
  }
  iVar2 = -1;
LAB_001ede46:
  if (iVar2 <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x27a,"void Abc_SopComplementVar(char *, int)");
  }
  if (*pSop != '\0') {
    do {
      if (pSop[iVar] == '0') {
        cVar4 = '1';
LAB_001ede6b:
        pSop[iVar] = cVar4;
      }
      else if (pSop[iVar] == '1') {
        cVar4 = '0';
        goto LAB_001ede6b;
      }
      pcVar1 = pSop + (iVar2 + 3);
      pSop = pSop + (iVar2 + 3);
    } while (*pcVar1 != '\0');
  }
  return;
}

Assistant:

void Abc_SopComplementVar( char * pSop, int iVar )
{
    char * pCube;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( iVar < nVars );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[iVar] == '0' )
            pCube[iVar] = '1';
        else if ( pCube[iVar] == '1' )
            pCube[iVar] = '0';
    }
}